

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_Star_Test.cpp
# Opt level: O0

void __thiscall
Planner_Start_Point_Test_Test::~Planner_Start_Point_Test_Test(Planner_Start_Point_Test_Test *this)

{
  Planner_Start_Point_Test_Test *this_local;
  
  ~Planner_Start_Point_Test_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Planner, Start_Point_Test) {
  auto coordinate = path[2];
  std::vector<int> Test_Node = { coordinate.x, coordinate.y, coordinate.z };
  std::vector<double> Coordinates = Map.Get_Coordinate(Test_Node);
  ASSERT_EQ(Coordinates[0], 0);
  ASSERT_EQ(Coordinates[1], 0);
  ASSERT_EQ(Coordinates[2], 0);
}